

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<false>::listNameSpace(TC_parser<false> *this)

{
  TC_parser<false> *in_RDI;
  bool bVar1;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  TC_parser<false> *in_stack_000000e0;
  
  while( true ) {
    bVar1 = false;
    if (*in_RDI->reading_head == '|') {
      bVar1 = in_RDI->reading_head < in_RDI->endLine;
    }
    if (!bVar1) break;
    in_RDI->reading_head = in_RDI->reading_head + 1;
    nameSpace(in_RDI);
  }
  if ((in_RDI->reading_head != in_RDI->endLine) && (*in_RDI->reading_head != '\r')) {
    parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                  in_stack_000000c0);
  }
  return;
}

Assistant:

inline void listNameSpace()
  {
    while ((*reading_head == '|') && (reading_head < endLine))  // ListNameSpace --> '|' NameSpace ListNameSpace
    {
      ++reading_head;
      nameSpace();
    }
    if (reading_head != endLine && *reading_head != '\r')
    {
      // syntax error
      parserWarning("malformed example! '|' or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }